

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format_00;
  TestContext *pTVar1;
  int extraout_EAX;
  char *pcVar2;
  Texture2DFormatCase *pTVar3;
  RenderContext *pRVar4;
  char *pcVar5;
  TextureCubeFormatCase *pTVar6;
  Compressed2DFormatCase *pCVar7;
  ContextInfo *pCVar8;
  CompressedCubeFormatCase *pCVar9;
  int numStr;
  allocator<char> local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  int local_3cc;
  undefined1 local_3c8 [4];
  int face_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  allocator<char> local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  int local_2e8;
  int local_2e4;
  int face;
  int level;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  int potNumLevels;
  undefined1 local_2a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  undefined1 local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string descriptionBase;
  allocator<char> local_c9;
  undefined1 local_c8 [8];
  string nameBase;
  deUint32 dataType;
  deUint32 format;
  int formatNdx;
  anon_struct_16_3_5cb0d78b texFormats [8];
  TextureFormatTests *this_local;
  TestContext *pTVar10;
  
  memcpy(&format,&DAT_03279eb0,0x80);
  for (dataType = 0; (int)dataType < 8; dataType = dataType + 1) {
    format_00 = *(deUint32 *)&texFormats[(int)dataType].name;
    nameBase.field_2._12_4_ = *(undefined4 *)((long)&texFormats[(int)dataType].name + 4);
    pcVar2 = *(char **)(&format + (long)(int)dataType * 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,pcVar2,&local_c9);
    std::allocator<char>::~allocator(&local_c9);
    pcVar2 = glu::getTextureFormatName(format_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,pcVar2,&local_141);
    std::operator+(&local_120,&local_140,", ");
    pcVar2 = glu::getTypeName(nameBase.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &local_120,pcVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    pTVar3 = (Texture2DFormatCase *)operator_new(0xe8);
    local_189 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "_2d_pot");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   ", GL_TEXTURE_2D");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar3,pTVar1,pRVar4,pcVar2,pcVar5,format_00,nameBase.field_2._12_4_,0x80,0x80);
    local_189 = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    pTVar3 = (Texture2DFormatCase *)operator_new(0xe8);
    local_1d1 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "_2d_npot");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   ", GL_TEXTURE_2D");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar3,pTVar1,pRVar4,pcVar2,pcVar5,format_00,nameBase.field_2._12_4_,0x3f,0x70);
    local_1d1 = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    pTVar6 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_219 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "_cube_pot");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar6,pTVar1,pRVar4,pcVar2,pcVar5,format_00,nameBase.field_2._12_4_,0x40,0x40);
    local_219 = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    pTVar6 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_261 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "_cube_npot");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar6,pTVar1,pRVar4,pcVar2,pcVar5,format_00,nameBase.field_2._12_4_,0x39,0x39);
    local_261 = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_c8);
  }
  pCVar7 = (Compressed2DFormatCase *)operator_new(0xf8);
  filenames_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar10 = pTVar1;
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  numStr = (int)pTVar10;
  pCVar8 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  toStringVector_abi_cxx11_(&local_280,(Functional *)init::filenames,(char **)0x8,numStr);
  Compressed2DFormatCase::Compressed2DFormatCase
            (pCVar7,pTVar1,pRVar4,pCVar8,"etc1_2d_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",&local_280)
  ;
  filenames_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&potNumLevels,"data/etc1/photo_helsinki_113x89.pkm",
             (allocator<char> *)
             ((long)&potFilenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2a0,(value_type *)&potNumLevels);
  std::__cxx11::string::~string((string *)&potNumLevels);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&potFilenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pCVar7 = (Compressed2DFormatCase *)operator_new(0xf8);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar8 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Compressed2DFormatCase::Compressed2DFormatCase
            (pCVar7,pTVar1,pRVar4,pCVar8,"etc1_2d_npot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2a0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a0);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&face);
  for (local_2e4 = 0; local_2e4 < 7; local_2e4 = local_2e4 + 1) {
    for (local_2e8 = 0; local_2e8 < 6; local_2e8 = local_2e8 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,"data/etc1/skybox_",&local_389);
      std::operator+(&local_368,&local_388,init::faceExt[local_2e8]);
      std::operator+(&local_348,&local_368,"_mip_");
      de::toString<int>((string *)
                        &npotFilenames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2e4);
      std::operator+(&local_328,&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_308,&local_328,".pkm");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&face,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string
                ((string *)
                 &npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator(&local_389);
    }
  }
  pCVar9 = (CompressedCubeFormatCase *)operator_new(0x100);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar8 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  CompressedCubeFormatCase::CompressedCubeFormatCase
            (pCVar9,pTVar1,pRVar4,pCVar8,"etc1_cube_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&face);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3c8);
  for (local_3cc = 0; local_3cc < 6; local_3cc = local_3cc + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"data/etc1/skybox_61x61_",&local_431);
    std::operator+(&local_410,&local_430,init::faceExt[local_3cc]);
    std::operator+(&local_3f0,&local_410,".pkm");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3c8,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
  }
  pCVar9 = (CompressedCubeFormatCase *)operator_new(0x100);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar8 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  CompressedCubeFormatCase::CompressedCubeFormatCase
            (pCVar9,pTVar1,pRVar4,pCVar8,"etc1_cube_npot","GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3c8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&face);
  return extraout_EAX;
}

Assistant:

void TextureFormatTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32		format;
		deUint32		dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		addChild(new Texture2DFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType, 128, 128));
		addChild(new Texture2DFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType,  63, 112));
		addChild(new TextureCubeFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  64,  64));
		addChild(new TextureCubeFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  57,  57));
	}

	// ETC-1 compressed formats.
	{
		static const char* filenames[] =
		{
			"data/etc1/photo_helsinki_mip_0.pkm",
			"data/etc1/photo_helsinki_mip_1.pkm",
			"data/etc1/photo_helsinki_mip_2.pkm",
			"data/etc1/photo_helsinki_mip_3.pkm",
			"data/etc1/photo_helsinki_mip_4.pkm",
			"data/etc1/photo_helsinki_mip_5.pkm",
			"data/etc1/photo_helsinki_mip_6.pkm",
			"data/etc1/photo_helsinki_mip_7.pkm"
		};
		addChild(new Compressed2DFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", toStringVector(filenames, DE_LENGTH_OF_ARRAY(filenames))));
	}

	{
		vector<string> filenames;
		filenames.push_back("data/etc1/photo_helsinki_113x89.pkm");
		addChild(new Compressed2DFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_npot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", filenames));
	}

	{
		static const char* faceExt[] = { "neg_x", "pos_x", "neg_y", "pos_y", "neg_z", "pos_z" };

		const int		potNumLevels	= 7;
		vector<string>	potFilenames;
		for (int level = 0; level < potNumLevels; level++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				potFilenames.push_back(string("data/etc1/skybox_") + faceExt[face] + "_mip_" + de::toString(level) + ".pkm");

		addChild(new CompressedCubeFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP", potFilenames));

		vector<string> npotFilenames;
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			npotFilenames.push_back(string("data/etc1/skybox_61x61_") + faceExt[face] + ".pkm");

		addChild(new CompressedCubeFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_npot", "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP", npotFilenames));
	}
}